

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O2

void __thiscall
estl::state_machine<cd_fsm_def>::execute_actions
          (state_machine<cd_fsm_def> *this,state_type state,inputs_type *inputs,
          outputs_type *outputs)

{
  undefined8 *puVar1;
  actions_fun fn;
  
  get_action_function(&fn,this,state);
  if (fn.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_cd_fsm_def::inputs_type_&,_cd_fsm_def::outputs_type_&)>::operator()
              (&fn,inputs,outputs);
    std::_Function_base::~_Function_base(&fn.super__Function_base);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_00108d98;
  __cxa_throw(puVar1,&state_not_found::typeinfo,std::exception::~exception);
}

Assistant:

void execute_actions(state_type state, const inputs_type& inputs, outputs_type& outputs) const {
        const auto fn = get_action_function(state);
        if (!fn) {
            throw state_not_found{};
        }
        fn(inputs, outputs);
    }